

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raise.c
# Opt level: O0

int main(void)

{
  int iVar1;
  __sighandler_t p_Var2;
  _func_void_int *sighandler;
  
  p_Var2 = signal(6,(__sighandler_t)0x1);
  if (p_Var2 != (__sighandler_t)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x68,"sighandler == SIG_DFL");
  }
  iVar1 = raise(6);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x6b,"raise( SIGABRT ) == 0");
  }
  p_Var2 = signal(6,test_handler);
  if (p_Var2 != (__sighandler_t)0x1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x6d,"signal( SIGABRT, test_handler ) == SIG_IGN");
  }
  expected_signal = 6;
  iVar1 = raise(6);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x70,"raise( SIGABRT ) == 0");
  }
  if (flag != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x71,"flag == 1");
  }
  p_Var2 = signal(6,test_handler);
  if (p_Var2 != (__sighandler_t)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x76,"sighandler == SIG_DFL");
  }
  flag = 0;
  iVar1 = raise(6);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x7a,"raise( SIGABRT ) == 0");
  }
  if (flag != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x7b,"flag == 1");
  }
  p_Var2 = signal(0xf,test_handler);
  if (p_Var2 != (__sighandler_t)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x7d,"signal( SIGTERM, test_handler ) == SIG_DFL");
  }
  expected_signal = 0xf;
  iVar1 = raise(0xf);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x80,"raise( SIGTERM ) == 0");
  }
  if (flag != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/signal/raise.c, line %d - %s\n"
           ,0x81,"flag == 1");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    void ( *sighandler )( int );
    /* Could be other than SIG_DFL if you changed the implementation. */
    sighandler = signal( SIGABRT, SIG_IGN );
#ifndef REGTEST
    TESTCASE( sighandler == SIG_DFL );
#endif
    /* Should be ignored. */
    TESTCASE( raise( SIGABRT ) == 0 );
    /* Installing test handler, old handler should be returned */
    TESTCASE( signal( SIGABRT, test_handler ) == SIG_IGN );
    /* Raising and checking SIGABRT */
    expected_signal = SIGABRT;
    TESTCASE( raise( SIGABRT ) == 0 );
    TESTCASE( flag == 1 );
    /* Re-installing test handler, should have been reset to default */
    /* Could be other than SIG_DFL if you changed the implementation. */
    sighandler = signal( SIGABRT, test_handler );
#ifndef REGTEST
    TESTCASE( sighandler == SIG_DFL );
#endif
    /* Raising and checking SIGABRT */
    flag = 0;
    TESTCASE( raise( SIGABRT ) == 0 );
    TESTCASE( flag == 1 );
    /* Installing test handler for different signal... */
    TESTCASE( signal( SIGTERM, test_handler ) == SIG_DFL );
    /* Raising and checking SIGTERM */
    expected_signal = SIGTERM;
    TESTCASE( raise( SIGTERM ) == 0 );
    TESTCASE( flag == 1 );
    /* void expression to avoid "unused" warning in regtest */
    (void)sighandler;
    return TEST_RESULTS;
}